

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

void mpc_err_delete_internal(mpc_input_t *i,mpc_err_t *x)

{
  mpc_mem_t *pmVar1;
  mpc_input_t *pmVar2;
  mpc_input_t *pmVar3;
  long lVar4;
  
  if (x != (mpc_err_t *)0x0) {
    if (0 < x->expected_num) {
      lVar4 = 0;
      do {
        pmVar2 = (mpc_input_t *)x->expected[lVar4];
        if (pmVar2 < i + 1 && i->mem <= pmVar2) {
          i->mem_full[(ulong)((long)pmVar2 - (long)i->mem) >> 6] = '\0';
        }
        else {
          free(pmVar2);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < x->expected_num);
    }
    pmVar3 = (mpc_input_t *)x->expected;
    pmVar1 = i->mem;
    pmVar2 = i + 1;
    if (pmVar3 < pmVar2 && pmVar1 <= pmVar3) {
      i->mem_full[(ulong)((long)pmVar3 - (long)pmVar1) >> 6] = '\0';
    }
    else {
      free(pmVar3);
    }
    pmVar3 = (mpc_input_t *)x->filename;
    if (pmVar3 < pmVar2 && pmVar1 <= pmVar3) {
      i->mem_full[(ulong)((long)pmVar3 - (long)pmVar1) >> 6] = '\0';
    }
    else {
      free(pmVar3);
    }
    pmVar3 = (mpc_input_t *)x->failure;
    if (pmVar3 < pmVar2 && pmVar1 <= pmVar3) {
      i->mem_full[(ulong)((long)pmVar3 - (long)pmVar1) >> 6] = '\0';
    }
    else {
      free(pmVar3);
    }
    if (pmVar2 <= x || x < pmVar1) {
      free(x);
      return;
    }
    i->mem_full[(ulong)((long)x - (long)pmVar1) >> 6] = '\0';
  }
  return;
}

Assistant:

static void mpc_err_delete_internal(mpc_input_t *i, mpc_err_t *x) {
  int j;
  if (x == NULL) { return; }
  for (j = 0; j < x->expected_num; j++) { mpc_free(i, x->expected[j]); }
  mpc_free(i, x->expected);
  mpc_free(i, x->filename);
  mpc_free(i, x->failure);
  mpc_free(i, x);
}